

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

int __thiscall re2::Regexp::Ref(Regexp *this)

{
  uint uVar1;
  uint *puVar2;
  long in_RDI;
  map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
  *unaff_retaddr;
  MutexLock l;
  Mutex *in_stack_ffffffffffffffb8;
  MutexLock *in_stack_ffffffffffffffc0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*(ushort *)(in_RDI + 4) < 0xffff) {
    uVar1 = (uint)*(ushort *)(in_RDI + 4);
  }
  else {
    MutexLock::MutexLock(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    puVar2 = (uint *)std::
                     map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
                     ::operator[](unaff_retaddr,
                                  (key_type *)
                                  CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    uVar1 = *puVar2;
    MutexLock::~MutexLock((MutexLock *)0x227035);
  }
  return uVar1;
}

Assistant:

int Regexp::Ref() {
  if (ref_ < kMaxRef)
    return ref_;

  MutexLock l(ref_mutex);
  return (*ref_map)[this];
}